

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Tbc::Text::Text(Text *this,string *_str,TextAttributes *_attr)

{
  size_t sVar1;
  undefined7 uVar2;
  pointer pcVar3;
  size_t sVar4;
  long lVar5;
  undefined8 this_00;
  char cVar6;
  _Alloc_hider _pos;
  long lVar7;
  string local_f8 [8];
  string wrappableChars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  TextAttributes *local_78;
  long local_70;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_68;
  undefined1 local_60 [8];
  string remainder;
  size_t local_38;
  
  (this->str)._M_dataplus._M_p = (pointer)&(this->str).field_2;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = '\0';
  sVar4 = _attr->indent;
  sVar1 = _attr->width;
  cVar6 = _attr->tabChar;
  uVar2 = *(undefined7 *)&_attr->field_0x19;
  (this->attr).initialIndent = _attr->initialIndent;
  (this->attr).indent = sVar4;
  (this->attr).width = sVar1;
  (this->attr).tabChar = cVar6;
  *(undefined7 *)&(this->attr).field_0x19 = uVar2;
  local_68 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->lines;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  remainder.field_2._8_8_ = this;
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8," [({.,/|\\-",(allocator<char> *)local_60);
  sVar4 = _attr->initialIndent;
  local_38 = _attr->indent;
  std::__cxx11::string::string((string *)local_60,(string *)_str);
  this_00 = remainder.field_2._8_8_;
  local_78 = _attr;
  if (sVar4 != 0xffffffffffffffff) {
    local_38 = sVar4;
  }
  do {
    if (remainder._M_dataplus._M_p == (pointer)0x0) {
LAB_0015edb5:
      std::__cxx11::string::~string((string *)local_60);
      std::__cxx11::string::~string(local_f8);
      return;
    }
    if (0x7ce0 < (ulong)((long)(((Text *)this_00)->lines).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(((Text *)this_00)->lines).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"... message truncated due to excessive size",
                 (allocator<char> *)(wrappableChars.field_2._M_local_buf + 8));
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_68,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      goto LAB_0015edb5;
    }
    _pos._M_p = (pointer)(_attr->width - local_38);
    if (remainder._M_dataplus._M_p <= _pos._M_p) {
      _pos._M_p = remainder._M_dataplus._M_p;
    }
    cVar6 = (char)local_60;
    pcVar3 = (pointer)std::__cxx11::string::find(cVar6,10);
    if (pcVar3 < _pos._M_p) {
      _pos._M_p = pcVar3;
    }
    local_70 = std::__cxx11::string::rfind(cVar6,(ulong)(uint)(int)_attr->tabChar);
    if (local_70 != -1) {
      cVar6 = *(char *)((long)local_60 + (long)_pos._M_p);
      std::__cxx11::string::substr((ulong)((long)&wrappableChars.field_2 + 8),(ulong)local_60);
      std::__cxx11::string::substr((ulong)&local_b8,(ulong)local_60);
      std::operator+(&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (wrappableChars.field_2._M_local_buf + 8),&local_b8);
      _pos._M_p = _pos._M_p + -(ulong)(cVar6 == '\n');
      std::__cxx11::string::operator=((string *)local_60,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)(wrappableChars.field_2._M_local_buf + 8));
      this_00 = remainder.field_2._8_8_;
      _attr = local_78;
    }
    if (_pos._M_p == remainder._M_dataplus._M_p) {
      spliceLine((Text *)this_00,local_38,(string *)local_60,(size_t)_pos._M_p);
    }
    else if (*(char *)((long)local_60 + (long)_pos._M_p) == '\n') {
      spliceLine((Text *)this_00,local_38,(string *)local_60,(size_t)_pos._M_p);
      if ((_pos._M_p < (pointer)0x2) || (remainder._M_dataplus._M_p != (pointer)0x1)) {
        std::__cxx11::string::substr((ulong)&local_98,(ulong)local_60);
        std::__cxx11::string::operator=((string *)local_60,(string *)&local_98);
        std::__cxx11::string::~string((string *)&local_98);
      }
      local_38 = _attr->indent;
    }
    else {
      sVar4 = std::__cxx11::string::find_last_of((string *)local_60,(ulong)local_f8);
      if (sVar4 - 1 < 0xfffffffffffffffe) {
        spliceLine((Text *)this_00,local_38,(string *)local_60,sVar4);
        lVar7 = local_70;
        if (*(char *)local_60 == ' ') {
          std::__cxx11::string::substr((ulong)&local_98,(ulong)local_60);
          std::__cxx11::string::operator=((string *)local_60,(string *)&local_98);
          std::__cxx11::string::~string((string *)&local_98);
        }
      }
      else {
        spliceLine((Text *)this_00,local_38,(string *)local_60,(size_t)(_pos._M_p + -1));
        lVar7 = local_70;
        std::__cxx11::string::append
                  ((char *)((((Text *)this_00)->lines).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1));
      }
      if ((long)(((Text *)this_00)->lines).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(((Text *)this_00)->lines).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x20) {
        local_38 = _attr->indent;
      }
      lVar5 = 0;
      if (lVar7 != -1) {
        lVar5 = lVar7;
      }
      local_38 = local_38 + lVar5;
    }
  } while( true );
}

Assistant:

Text( std::string const& _str, TextAttributes const& _attr = TextAttributes() )
        : attr( _attr )
        {
            std::string wrappableChars = " [({.,/|\\-";
            std::size_t indent = _attr.initialIndent != std::string::npos
                ? _attr.initialIndent
                : _attr.indent;
            std::string remainder = _str;

            while( !remainder.empty() ) {
                if( lines.size() >= 1000 ) {
                    lines.push_back( "... message truncated due to excessive size" );
                    return;
                }
                std::size_t tabPos = std::string::npos;
                std::size_t width = (std::min)( remainder.size(), _attr.width - indent );
                std::size_t pos = remainder.find_first_of( '\n' );
                if( pos <= width ) {
                    width = pos;
                }
                pos = remainder.find_last_of( _attr.tabChar, width );
                if( pos != std::string::npos ) {
                    tabPos = pos;
                    if( remainder[width] == '\n' )
                        width--;
                    remainder = remainder.substr( 0, tabPos ) + remainder.substr( tabPos+1 );
                }

                if( width == remainder.size() ) {
                    spliceLine( indent, remainder, width );
                }
                else if( remainder[width] == '\n' ) {
                    spliceLine( indent, remainder, width );
                    if( width <= 1 || remainder.size() != 1 )
                        remainder = remainder.substr( 1 );
                    indent = _attr.indent;
                }
                else {
                    pos = remainder.find_last_of( wrappableChars, width );
                    if( pos != std::string::npos && pos > 0 ) {
                        spliceLine( indent, remainder, pos );
                        if( remainder[0] == ' ' )
                            remainder = remainder.substr( 1 );
                    }
                    else {
                        spliceLine( indent, remainder, width-1 );
                        lines.back() += "-";
                    }
                    if( lines.size() == 1 )
                        indent = _attr.indent;
                    if( tabPos != std::string::npos )
                        indent += tabPos;
                }
            }
        }